

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::init
          (BaseRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  int extraout_EAX;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  NotSupportedError *pNVar5;
  char *pcVar6;
  mapped_type *this_00;
  ShaderProgram *this_01;
  ProgramSources *pPVar7;
  TestError *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  Enum<int,_2UL> EVar11;
  MessageBuilder local_898;
  MessageBuilder local_718;
  undefined1 local_591;
  GetNameFunc local_590;
  int local_588;
  GetNameFunc local_580;
  int local_578;
  string local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  undefined1 local_52a;
  allocator<char> local_529;
  string local_528;
  int local_508;
  undefined1 local_501;
  GLenum error_1;
  int local_4f8;
  GetNameFunc local_4f0;
  int local_4e8;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_49a;
  allocator<char> local_499;
  string local_498;
  undefined1 local_471;
  GetNameFunc local_470;
  int local_468;
  GetNameFunc local_460;
  int local_458;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_40a;
  allocator<char> local_409;
  string local_408;
  int local_3e8;
  undefined1 local_3e2;
  allocator<char> local_3e1;
  GLenum error;
  undefined1 local_3b9;
  string local_3b8;
  ShaderSource local_398;
  string local_370;
  ShaderSource local_350;
  ProgramSources local_328;
  allocator<char> local_251;
  key_type local_250;
  undefined1 local_230 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_1f8;
  undefined1 local_1d8 [8];
  StringTemplate fragmentSource;
  string local_1b0;
  undefined1 local_190 [8];
  StringTemplate vertexSource;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int local_108;
  undefined1 local_101;
  GLint maxSampleCount;
  string local_e0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  int local_20;
  int msaaTargetSamples;
  int height;
  int width;
  Functions *gl;
  BaseRenderingCase *this_local;
  
  gl = (Functions *)this;
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _height = CONCAT44(extraout_var,iVar2);
  pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  msaaTargetSamples = tcu::RenderTarget::getWidth(pRVar4);
  pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  local_20 = tcu::RenderTarget::getHeight(pRVar4);
  local_24 = -1;
  if ((this->m_renderTarget == RENDERTARGET_DEFAULT) &&
     ((msaaTargetSamples < this->m_renderSize || (local_20 < this->m_renderSize)))) {
    local_101 = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Render target size must be at least ",&local_a9);
    de::toString<int>(&local_e0,&this->m_renderSize);
    std::operator+(&local_88,&local_a8,&local_e0);
    std::operator+(&local_68,&local_88,"x");
    de::toString<int>((string *)&maxSampleCount,&this->m_renderSize);
    std::operator+(&local_48,&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxSampleCount);
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_48);
    local_101 = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
    local_108 = 0;
    (**(code **)(_height + 0x880))(0x8d41,this->m_fboInternalFormat,0x80a9,1,&local_108);
    if (this->m_numRequestedSamples == -2) {
      local_24 = local_108;
    }
    else {
      if (local_108 < this->m_numRequestedSamples) {
        vertexSource.m_template.field_2._M_local_buf[0xf] = '\x01';
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        de::toString<int>(&local_168,&this->m_numRequestedSamples);
        std::operator+(&local_148,"Test requires ",&local_168);
        std::operator+(&local_128,&local_148,"x msaa rbo");
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_128);
        vertexSource.m_template.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      local_24 = this->m_numRequestedSamples;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\n${INTERPOLATION}out highp vec4 v_color;\nuniform highp float u_pointSize;\nvoid main ()\n{\n\tgl_Position = a_position;\n\tgl_PointSize = u_pointSize;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)(fragmentSource.m_template.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_190,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(fragmentSource.m_template.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "#version 300 es\nlayout(location = 0) out highp vec4 fragColor;\n${INTERPOLATION}in highp vec4 v_color;\nvoid main ()\n{\n\tfragColor = v_color;\n}\n"
             ,(allocator<char> *)
              ((long)&params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_1d8,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_230);
  pcVar6 = "";
  if ((this->m_flatshade & 1U) != 0) {
    pcVar6 = "flat ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"INTERPOLATION",&local_251);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_230,&local_250);
  std::__cxx11::string::operator=((string *)this_00,pcVar6);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  local_3b9 = 1;
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_328);
  tcu::StringTemplate::specialize
            (&local_370,(StringTemplate *)local_190,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_230);
  glu::VertexSource::VertexSource((VertexSource *)&local_350,&local_370);
  pPVar7 = glu::ProgramSources::operator<<(&local_328,&local_350);
  tcu::StringTemplate::specialize
            (&local_3b8,(StringTemplate *)local_1d8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_230);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_398,&local_3b8);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_398);
  glu::ShaderProgram::ShaderProgram(this_01,pRVar3,pPVar7);
  local_3b9 = 0;
  this->m_shader = this_01;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  glu::ProgramSources::~ProgramSources(&local_328);
  bVar1 = glu::ShaderProgram::isOk(this->m_shader);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_230);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_1d8);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_190);
    if (this->m_renderTarget != RENDERTARGET_DEFAULT) {
      (**(code **)(_height + 0x6d0))(1,&this->m_fbo);
      (**(code **)(_height + 0x78))(0x8d40,this->m_fbo);
      if (this->m_renderTarget == RENDERTARGET_TEXTURE_2D) {
        (**(code **)(_height + 0x6f8))(1,&this->m_texture);
        (**(code **)(_height + 0xb8))(0xde1,this->m_texture);
        (**(code **)(_height + 0x1380))
                  (0xde1,1,this->m_fboInternalFormat,this->m_renderSize,this->m_renderSize);
        local_3e8 = (**(code **)(_height + 0x800))();
        if (local_3e8 == 0x505) {
          local_40a = 1;
          pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"could not create target texture, got out of memory",
                     &local_409);
          tcu::NotSupportedError::NotSupportedError(pNVar5,&local_408);
          local_40a = 0;
          __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        if (local_3e8 != 0) {
          local_471 = 1;
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          EVar11 = glu::getErrorStr(local_3e8);
          local_470 = EVar11.m_getName;
          local_468 = EVar11.m_value;
          local_460 = local_470;
          local_458 = local_468;
          de::toString<tcu::Format::Enum<int,2ul>>(&local_450,(de *)&local_460,EVar11._8_8_);
          std::operator+(&local_430,"got ",&local_450);
          tcu::TestError::TestError(pTVar8,&local_430);
          local_471 = 0;
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (**(code **)(_height + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texture,0);
      }
      else if (this->m_renderTarget - RENDERTARGET_RBO_SINGLESAMPLE < 2) {
        (**(code **)(_height + 0x6e8))(1,&this->m_rbo);
        (**(code **)(_height + 0xa0))(0x8d41,this->m_rbo);
        if (this->m_renderTarget == RENDERTARGET_RBO_SINGLESAMPLE) {
          (**(code **)(_height + 0x1238))
                    (0x8d41,this->m_fboInternalFormat,this->m_renderSize,this->m_renderSize);
        }
        else if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
          (**(code **)(_height + 0x1240))
                    (0x8d41,local_24,this->m_fboInternalFormat,this->m_renderSize,this->m_renderSize
                    );
        }
        local_3e8 = (**(code **)(_height + 0x800))();
        if (local_3e8 == 0x505) {
          local_49a = 1;
          pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,"could not create target texture, got out of memory",
                     &local_499);
          tcu::NotSupportedError::NotSupportedError(pNVar5,&local_498);
          local_49a = 0;
          __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        if (local_3e8 != 0) {
          local_501 = 1;
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          EVar11 = glu::getErrorStr(local_3e8);
          _error_1 = EVar11.m_getName;
          local_4f8 = EVar11.m_value;
          local_4f0 = _error_1;
          local_4e8 = local_4f8;
          de::toString<tcu::Format::Enum<int,2ul>>(&local_4e0,(de *)&local_4f0,EVar11._8_8_);
          std::operator+(&local_4c0,"got ",&local_4e0);
          tcu::TestError::TestError(pTVar8,&local_4c0);
          local_501 = 0;
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (**(code **)(_height + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rbo);
      }
    }
    if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
      (**(code **)(_height + 0x6d0))(1,&this->m_blitDstFbo);
      (**(code **)(_height + 0x78))(0x8d40,this->m_blitDstFbo);
      (**(code **)(_height + 0x6e8))(1,&this->m_blitDstRbo);
      (**(code **)(_height + 0xa0))(0x8d41,this->m_blitDstRbo);
      (**(code **)(_height + 0x1238))(0x8d41,0x8058,this->m_renderSize,this->m_renderSize);
      local_508 = (**(code **)(_height + 0x800))();
      if (local_508 == 0x505) {
        local_52a = 1;
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,"could not create blit target, got out of memory",&local_529
                  );
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_528);
        local_52a = 0;
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      if (local_508 != 0) {
        local_591 = 1;
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        EVar11 = glu::getErrorStr(local_508);
        local_590 = EVar11.m_getName;
        local_588 = EVar11.m_value;
        local_580 = local_590;
        local_578 = local_588;
        de::toString<tcu::Format::Enum<int,2ul>>(&local_570,(de *)&local_580,EVar11._8_8_);
        std::operator+(&local_550,"got ",&local_570);
        tcu::TestError::TestError(pTVar8,&local_550);
        local_591 = 0;
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(_height + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_blitDstRbo);
      (**(code **)(_height + 0x78))(0x8d40,this->m_fbo);
    }
    if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
      pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
      iVar2 = tcu::RenderTarget::getNumSamples(pRVar4);
      this->m_numSamples = iVar2;
    }
    else if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
      this->m_numSamples = -1;
      (**(code **)(_height + 0xa0))(0x8d41,this->m_rbo);
      (**(code **)(_height + 0xa30))(0x8d41,0x8cab,&this->m_numSamples);
      err = (**(code **)(_height + 0x800))();
      glu::checkError(err,"get RENDERBUFFER_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizationTests.cpp"
                      ,0x12d);
    }
    else {
      this->m_numSamples = 0;
    }
    (**(code **)(_height + 0x868))(0xd50,&this->m_subpixelBits);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_718,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_718,(char (*) [16])"Sample count = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&this->m_numSamples);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_718);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_898,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_898,(char (*) [17])0x2c0dad3);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&this->m_subpixelBits);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_898);
    return extraout_EAX;
  }
  local_3e2 = 1;
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"could not create shader",&local_3e1);
  tcu::TestError::TestError(pTVar8,(string *)&error);
  local_3e2 = 0;
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void BaseRenderingCase::init (void)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const int				width					= m_context.getRenderTarget().getWidth();
	const int				height					= m_context.getRenderTarget().getHeight();
	int						msaaTargetSamples		= -1;

	// Requirements

	if (m_renderTarget == RENDERTARGET_DEFAULT && (width < m_renderSize || height < m_renderSize))
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));

	if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		glw::GLint maxSampleCount = 0;
		gl.getInternalformativ(GL_RENDERBUFFER, m_fboInternalFormat, GL_SAMPLES, 1, &maxSampleCount);

		if (m_numRequestedSamples == SAMPLE_COUNT_MAX)
			msaaTargetSamples = maxSampleCount;
		else if (maxSampleCount >= m_numRequestedSamples)
			msaaTargetSamples = m_numRequestedSamples;
		else
			throw tcu::NotSupportedError("Test requires " + de::toString(m_numRequestedSamples) + "x msaa rbo");
	}

	// Gen shader

	{
		tcu::StringTemplate					vertexSource	(s_shaderVertexTemplate);
		tcu::StringTemplate					fragmentSource	(s_shaderFragmentTemplate);
		std::map<std::string, std::string>	params;

		params["INTERPOLATION"] = (m_flatshade) ? ("flat ") : ("");

		m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource.specialize(params)) << glu::FragmentSource(fragmentSource.specialize(params)));
		if (!m_shader->isOk())
			throw tcu::TestError("could not create shader");
	}

	// Fbo
	if (m_renderTarget != RENDERTARGET_DEFAULT)
	{
		glw::GLenum error;

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);

		switch (m_renderTarget)
		{
			case RENDERTARGET_TEXTURE_2D:
			{
				gl.genTextures(1, &m_texture);
				gl.bindTexture(GL_TEXTURE_2D, m_texture);
				gl.texStorage2D(GL_TEXTURE_2D, 1, m_fboInternalFormat, m_renderSize, m_renderSize);

				error = gl.getError();
				if (error == GL_OUT_OF_MEMORY)
					throw tcu::NotSupportedError("could not create target texture, got out of memory");
				else if (error != GL_NO_ERROR)
					throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

				gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
				break;
			}

			case RENDERTARGET_RBO_SINGLESAMPLE:
			case RENDERTARGET_RBO_MULTISAMPLE:
			{
				gl.genRenderbuffers(1, &m_rbo);
				gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);

				if (m_renderTarget == RENDERTARGET_RBO_SINGLESAMPLE)
					gl.renderbufferStorage(GL_RENDERBUFFER, m_fboInternalFormat, m_renderSize, m_renderSize);
				else if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
					gl.renderbufferStorageMultisample(GL_RENDERBUFFER, msaaTargetSamples, m_fboInternalFormat, m_renderSize, m_renderSize);
				else
					DE_ASSERT(false);

				error = gl.getError();
				if (error == GL_OUT_OF_MEMORY)
					throw tcu::NotSupportedError("could not create target texture, got out of memory");
				else if (error != GL_NO_ERROR)
					throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

				gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo);
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	// Resolve (blitFramebuffer) target fbo for MSAA targets
	if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		glw::GLenum error;

		gl.genFramebuffers(1, &m_blitDstFbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_blitDstFbo);

		gl.genRenderbuffers(1, &m_blitDstRbo);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_blitDstRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, m_renderSize, m_renderSize);

		error = gl.getError();
		if (error == GL_OUT_OF_MEMORY)
			throw tcu::NotSupportedError("could not create blit target, got out of memory");
		else if (error != GL_NO_ERROR)
			throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_blitDstRbo);

		// restore state
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	}

	// Query info

	if (m_renderTarget == RENDERTARGET_DEFAULT)
		m_numSamples = m_context.getRenderTarget().getNumSamples();
	else if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		m_numSamples = -1;
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);
		gl.getRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, &m_numSamples);

		GLU_EXPECT_NO_ERROR(gl.getError(), "get RENDERBUFFER_SAMPLES");
	}
	else
		m_numSamples = 0;

	gl.getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);

	m_testCtx.getLog() << tcu::TestLog::Message << "Sample count = " << m_numSamples << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;
}